

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  int iVar1;
  Location *pLVar2;
  Rep *pRVar3;
  ArenaImpl *this_00;
  LogMessage *pLVar4;
  string *psVar5;
  Arena *pAVar6;
  ulong uVar7;
  ArenaStringPtr *pAVar8;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (((this->location_->_has_bits_).has_bits_[0] & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1ee);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (((this->location_->_has_bits_).has_bits_[0] & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1ef);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_a1,pLVar4);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (leading->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 1;
    pAVar6 = (Arena *)(pLVar2->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    pAVar8 = &pLVar2->leading_comments_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar8,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)pAVar8->ptr_);
  }
  if (trailing->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 2;
    pAVar6 = (Arena *)(pLVar2->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    pAVar8 = &pLVar2->trailing_comments_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    if (pAVar8->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar8,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)pAVar8->ptr_);
  }
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pLVar2 = this->location_;
      pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar3 == (Rep *)0x0) {
LAB_0030c4fa:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase,
                   (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0030c509:
        pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        pRVar3->allocated_size = pRVar3->allocated_size + 1;
        this_00 = (ArenaImpl *)
                  (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
        if (this_00 == (ArenaImpl *)0x0) {
          psVar5 = (string *)operator_new(0x20);
        }
        else {
          if (this_00[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          }
          psVar5 = (string *)
                   internal::ArenaImpl::AllocateAlignedAndAddCleanup
                             (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
        }
        *(string **)psVar5 = psVar5 + 0x10;
        *(long *)(psVar5 + 8) = 0;
        psVar5[0x10] = (string)0x0;
        pRVar3 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        pRVar3->elements[iVar1] = psVar5;
      }
      else {
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar3->allocated_size <= iVar1) {
          if (pRVar3->allocated_size ==
              (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_0030c4fa;
          goto LAB_0030c509;
        }
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar5 = (string *)pRVar3->elements[iVar1];
      }
      std::__cxx11::string::swap(psVar5);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(detached_comments->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(detached_comments);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}